

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.h
# Opt level: O0

LinkedToken * __thiscall Linker::getLinkedToken(Linker *this,Token *token)

{
  LinkedToken *pLVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  format_string_t<const_std::__cxx11::basic_string<char>_&> fmt;
  format_string_t<const_std::__cxx11::basic_string<char>_&> fmt_00;
  spdlog *local_c8 [2];
  spdlog *local_b8 [4];
  anon_class_8_1_a8b0a919 local_98;
  function<bool_(const_LinkedToken_&)> local_90;
  LinkedToken *local_70;
  LinkedToken *entry;
  Token *token_local;
  Linker *this_local;
  spdlog **local_50;
  char *local_48;
  spdlog **local_40;
  char *local_38;
  spdlog **local_30;
  char *local_28;
  spdlog **local_20;
  Linker *local_18;
  char *local_10;
  
  local_98.token = token;
  entry = (LinkedToken *)token;
  token_local = (Token *)this;
  std::function<bool(LinkedToken_const&)>::
  function<Linker::getLinkedToken(Token_const&)::_lambda(LinkedToken_const&)_1_,void>
            ((function<bool(LinkedToken_const&)> *)&local_90,&local_98);
  pLVar1 = Cache<LinkedToken>::find(&this->tokenCache,&local_90);
  std::function<bool_(const_LinkedToken_&)>::~function(&local_90);
  local_70 = pLVar1;
  if (pLVar1 == (LinkedToken *)0x0) {
    local_40 = local_c8;
    local_48 = "\'{}\' not in cache, starting search";
    local_38 = "\'{}\' not in cache, starting search";
    local_c8[0] = (spdlog *)0x3155e4;
    local_30 = local_40;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Catch::clara::std::char_traits<char>::length("\'{}\' not in cache, starting search");
    local_10 = local_48;
    fmt_00.str_.size_ = (size_t)entry;
    fmt_00.str_.data_ = (char *)pbVar2;
    spdlog::info<std::__cxx11::string_const&>(local_c8[0],fmt_00,pbVar2);
    local_70 = searchForLink(this,&entry->token);
  }
  else {
    local_50 = local_b8;
    this_local = (Linker *)anon_var_dwarf_2185e1;
    local_28 = "Found \'{}\' in cache";
    local_b8[0] = (spdlog *)0x3155d0;
    local_20 = local_50;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Catch::clara::std::char_traits<char>::length("Found \'{}\' in cache");
    local_18 = this_local;
    fmt.str_.size_ = (size_t)entry;
    fmt.str_.data_ = (char *)pbVar2;
    spdlog::info<std::__cxx11::string_const&>(local_b8[0],fmt,pbVar2);
  }
  return local_70;
}

Assistant:

LinkedToken* getLinkedToken(const Token& token) {
			LinkedToken* entry = tokenCache.find([&](const LinkedToken& linkedToken) {
				return linkedToken == token;
			});

			if (entry != nullptr) {
				spdlog::info("Found '{}' in cache", token.content);
			} else {
				spdlog::info("'{}' not in cache, starting search", token.content);
				entry = searchForLink(token);
			}
			return entry;
		}